

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O1

Args * Args::parse(Args *__return_storage_ptr__,int argc,char **argv)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  size_type *psVar5;
  pointer pcVar6;
  uint uVar7;
  Args *pAVar8;
  ulong uVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inputArg;
  SwitchArg mipsUserToKernelArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  printSymbolValueArg;
  SwitchArg mipsKernelToUserArg;
  SwitchArg printEntryArg;
  SwitchArg printLowestVaddrArg;
  SwitchArg printHighestVaddrArg;
  CmdLine cmdLine;
  ValueArg<int> roundToPageArg;
  string local_810;
  uint local_7ec;
  string local_7e8;
  Args *local_7c0;
  char **local_7b8;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  string local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [163];
  undefined2 local_59d;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  undefined1 local_488 [163];
  undefined2 local_3e5;
  undefined1 local_3e0 [163];
  undefined2 local_33d;
  undefined1 local_338 [163];
  undefined2 local_295;
  undefined1 local_290 [163];
  undefined2 local_1ed;
  CmdLine local_1e8;
  ValueArg<int> local_108;
  
  (__return_storage_ptr__->printSymbolValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->printSymbolValue).field_2;
  (__return_storage_ptr__->printSymbolValue)._M_string_length = 0;
  (__return_storage_ptr__->printSymbolValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->input)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->input).field_2;
  (__return_storage_ptr__->input)._M_string_length = 0;
  (__return_storage_ptr__->input).field_2._M_local_buf[0] = '\0';
  psVar4 = &local_598.super_Arg._flag._M_string_length;
  local_7c0 = __return_storage_ptr__;
  local_7b8 = argv;
  local_598.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"object info printer","");
  psVar5 = &local_7b0.
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_Arg._flag._M_string_length;
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"0.1","");
  TCLAP::CmdLine::CmdLine(&local_1e8,(string *)&local_598,' ',(string *)&local_7b0,true);
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (local_598.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_598.super_Arg._vptr_Arg);
  }
  local_598.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"r","");
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"round-to-page","");
  local_7ec = argc;
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"Round output up","");
  pcVar6 = local_3e0 + 0x10;
  local_3e0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"bytes","");
  TCLAP::ValueArg<int>::ValueArg
            (&local_108,(string *)&local_598,(string *)&local_7b0,(string *)local_290,false,0,
             (string *)local_3e0,&local_1e8.super_CmdLineInterface,(Visitor *)0x0);
  if ((pointer)local_3e0._0_8_ != pcVar6) {
    operator_delete((void *)local_3e0._0_8_);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_);
  }
  psVar5 = &local_7b0.
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_Arg._flag._M_string_length;
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (local_598.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_598.super_Arg._vptr_Arg);
  }
  local_598.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,">","");
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"highest-vaddr","");
  local_3e0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"Display highest vaddr","");
  TCLAP::Arg::Arg((Arg *)local_290,(string *)&local_598,(string *)&local_7b0,(string *)local_3e0,
                  false,false,(Visitor *)0x0);
  local_290._0_8_ = &PTR__Arg_00124188;
  local_1ed = 0;
  (*local_1e8.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((pointer)local_3e0._0_8_ != pcVar6) {
    operator_delete((void *)local_3e0._0_8_);
  }
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (local_598.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_598.super_Arg._vptr_Arg);
  }
  local_598.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"E","");
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"entrypoint","");
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"Display entrypoint","");
  TCLAP::Arg::Arg((Arg *)local_3e0,(string *)&local_598,(string *)&local_7b0,(string *)local_338,
                  false,false,(Visitor *)0x0);
  local_3e0._0_8_ = &PTR__Arg_00124188;
  local_33d = 0;
  (*local_1e8.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (local_598.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_598.super_Arg._vptr_Arg);
  }
  local_598.super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"<","");
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"lowest-vaddr","");
  pcVar6 = local_640 + 0x10;
  local_640._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"Display lowest vaddr","");
  TCLAP::Arg::Arg((Arg *)local_338,(string *)&local_598,(string *)&local_7b0,(string *)local_640,
                  false,false,(Visitor *)0x0);
  local_338._0_8_ = &PTR__Arg_00124188;
  local_295 = 0;
  (*local_1e8.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_1e8);
  if ((pointer)local_640._0_8_ != pcVar6) {
    operator_delete((void *)local_640._0_8_);
  }
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar5) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (local_598.super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_598.super_Arg._vptr_Arg);
  }
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"S","");
  local_640._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"symbol-value","");
  pcVar6 = local_488 + 0x10;
  local_488._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"Display symbol value","");
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"");
  paVar2 = &local_810.field_2;
  local_810._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"sym","");
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&local_598,(string *)&local_7b0,(string *)local_640,(string *)local_488,false,
             &local_660,&local_810,&local_1e8.super_CmdLineInterface,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != paVar2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p);
  }
  psVar4 = &local_7b0.
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_Arg._flag._M_string_length;
  if ((pointer)local_488._0_8_ != pcVar6) {
    operator_delete((void *)local_488._0_8_);
  }
  if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
    operator_delete((void *)local_640._0_8_);
  }
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"1","");
  local_488._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"to-kseg0","");
  local_810._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_810,"Convert MIPS VMAs to kseg1","");
  TCLAP::Arg::Arg((Arg *)local_640,(string *)&local_7b0,(string *)local_488,&local_810,false,false,
                  (Visitor *)0x0);
  local_640._0_8_ = &PTR__Arg_00124188;
  local_59d = 0;
  (*local_1e8.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != paVar2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if ((pointer)local_488._0_8_ != pcVar6) {
    operator_delete((void *)local_488._0_8_);
  }
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"0","");
  local_810._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"to-kuseg","");
  paVar3 = &local_7e8.field_2;
  local_7e8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7e8,"Convert MIPS VMAs to kuseg","");
  TCLAP::Arg::Arg((Arg *)local_488,(string *)&local_7b0,&local_810,&local_7e8,false,false,
                  (Visitor *)0x0);
  local_488._0_8_ = &PTR__Arg_00124188;
  local_3e5 = 0;
  (*local_1e8.super_CmdLineInterface._vptr_CmdLineInterface[3])(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != paVar3) {
    operator_delete(local_7e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != paVar2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if (local_7b0.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar4) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  local_810._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"input","");
  local_7e8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"Input (default stdin)","");
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"-","");
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"filename","");
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&local_7b0,&local_810,&local_7e8,false,&local_680,&local_6a0,
                      &local_1e8.super_CmdLineInterface,false,(Visitor *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p);
  }
  uVar7 = local_7ec;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != paVar3) {
    operator_delete(local_7e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != paVar2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  local_7e8._M_dataplus._M_p = (pointer)0x0;
  local_7e8._M_string_length = 0;
  local_7e8.field_2._M_allocated_capacity = 0;
  if (0 < (int)uVar7) {
    uVar9 = 0;
    do {
      std::__cxx11::string::string((string *)&local_810,local_7b8[uVar9],(allocator *)&local_6a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7e8,
                 &local_810);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_810._M_dataplus._M_p != paVar2) {
        operator_delete(local_810._M_dataplus._M_p);
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  TCLAP::CmdLine::parse
            (&local_1e8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_7e8);
  pAVar8 = local_7c0;
  psVar1 = &local_7c0->printSymbolValue;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_7e8);
  pAVar8->printHighestVaddr = local_1ed._0_1_;
  pAVar8->printLowestVaddr = local_295._0_1_;
  pAVar8->printEntry = local_33d._0_1_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  pAVar8->roundToPage = local_108.super_Arg._164_4_;
  pAVar8->mips0to1 = local_59d._0_1_;
  pAVar8->mips1to0 = local_3e5._0_1_;
  std::__cxx11::string::_M_assign((string *)&pAVar8->input);
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00124520;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._typeDesc._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._typeDesc.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._default._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._default.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._value._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._value.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._value._M_dataplus._M_p);
  }
  local_7b0.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00124030;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._requireLabel._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._requireLabel.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._description._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._description.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._name._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._name.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._flag._M_dataplus._M_p !=
      &local_7b0.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag.field_2) {
    operator_delete(local_7b0.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._flag._M_dataplus._M_p);
  }
  local_488._0_8_ = &PTR__Arg_00124030;
  if ((undefined1 *)local_488._112_8_ != local_488 + 0x80) {
    operator_delete((void *)local_488._112_8_);
  }
  if ((undefined1 *)local_488._72_8_ != local_488 + 0x58) {
    operator_delete((void *)local_488._72_8_);
  }
  if ((undefined1 *)local_488._40_8_ != local_488 + 0x38) {
    operator_delete((void *)local_488._40_8_);
  }
  if ((undefined1 *)local_488._8_8_ != local_488 + 0x18) {
    operator_delete((void *)local_488._8_8_);
  }
  local_640._0_8_ = &PTR__Arg_00124030;
  if ((undefined1 *)local_640._112_8_ != local_640 + 0x80) {
    operator_delete((void *)local_640._112_8_);
  }
  if ((undefined1 *)local_640._72_8_ != local_640 + 0x58) {
    operator_delete((void *)local_640._72_8_);
  }
  if ((undefined1 *)local_640._40_8_ != local_640 + 0x38) {
    operator_delete((void *)local_640._40_8_);
  }
  if ((undefined1 *)local_640._8_8_ != local_640 + 0x18) {
    operator_delete((void *)local_640._8_8_);
  }
  local_598.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00124520;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._typeDesc._M_dataplus._M_p != &local_598._typeDesc.field_2) {
    operator_delete(local_598._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._default._M_dataplus._M_p != &local_598._default.field_2) {
    operator_delete(local_598._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._value._M_dataplus._M_p != &local_598._value.field_2) {
    operator_delete(local_598._value._M_dataplus._M_p);
  }
  local_598.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00124030;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.super_Arg._requireLabel._M_dataplus._M_p !=
      &local_598.super_Arg._requireLabel.field_2) {
    operator_delete(local_598.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.super_Arg._description._M_dataplus._M_p !=
      &local_598.super_Arg._description.field_2) {
    operator_delete(local_598.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.super_Arg._name._M_dataplus._M_p != &local_598.super_Arg._name.field_2) {
    operator_delete(local_598.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.super_Arg._flag._M_dataplus._M_p != &local_598.super_Arg._flag.field_2) {
    operator_delete(local_598.super_Arg._flag._M_dataplus._M_p);
  }
  local_338._0_8_ = &PTR__Arg_00124030;
  if ((undefined1 *)local_338._112_8_ != local_338 + 0x80) {
    operator_delete((void *)local_338._112_8_);
  }
  if ((undefined1 *)local_338._72_8_ != local_338 + 0x58) {
    operator_delete((void *)local_338._72_8_);
  }
  if ((undefined1 *)local_338._40_8_ != local_338 + 0x38) {
    operator_delete((void *)local_338._40_8_);
  }
  if ((undefined1 *)local_338._8_8_ != local_338 + 0x18) {
    operator_delete((void *)local_338._8_8_);
  }
  local_3e0._0_8_ = &PTR__Arg_00124030;
  if ((undefined1 *)local_3e0._112_8_ != local_3e0 + 0x80) {
    operator_delete((void *)local_3e0._112_8_);
  }
  if ((undefined1 *)local_3e0._72_8_ != local_3e0 + 0x58) {
    operator_delete((void *)local_3e0._72_8_);
  }
  if ((undefined1 *)local_3e0._40_8_ != local_3e0 + 0x38) {
    operator_delete((void *)local_3e0._40_8_);
  }
  if ((undefined1 *)local_3e0._8_8_ != local_3e0 + 0x18) {
    operator_delete((void *)local_3e0._8_8_);
  }
  local_290._0_8_ = &PTR__Arg_00124030;
  if ((undefined1 *)local_290._112_8_ != local_290 + 0x80) {
    operator_delete((void *)local_290._112_8_);
  }
  if ((undefined1 *)local_290._72_8_ != local_290 + 0x58) {
    operator_delete((void *)local_290._72_8_);
  }
  if ((undefined1 *)local_290._40_8_ != local_290 + 0x38) {
    operator_delete((void *)local_290._40_8_);
  }
  if ((undefined1 *)local_290._8_8_ != local_290 + 0x18) {
    operator_delete((void *)local_290._8_8_);
  }
  local_108.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00124418;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._typeDesc._M_dataplus._M_p != &local_108._typeDesc.field_2) {
    operator_delete(local_108._typeDesc._M_dataplus._M_p);
  }
  local_108.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00124030;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.super_Arg._requireLabel._M_dataplus._M_p !=
      &local_108.super_Arg._requireLabel.field_2) {
    operator_delete(local_108.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.super_Arg._description._M_dataplus._M_p !=
      &local_108.super_Arg._description.field_2) {
    operator_delete(local_108.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.super_Arg._name._M_dataplus._M_p != &local_108.super_Arg._name.field_2) {
    operator_delete(local_108.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.super_Arg._flag._M_dataplus._M_p != &local_108.super_Arg._flag.field_2) {
    operator_delete(local_108.super_Arg._flag._M_dataplus._M_p);
  }
  TCLAP::CmdLine::~CmdLine(&local_1e8);
  return pAVar8;
}

Assistant:

static Args parse(int argc, char **argv){
		Args args;

		TCLAP::CmdLine cmdLine("object info printer", ' ', VERSION);
		TCLAP::ValueArg<int> roundToPageArg("r", "round-to-page", "Round output up", false, 0, "bytes", cmdLine);
		TCLAP::SwitchArg printHighestVaddrArg(">", "highest-vaddr", "Display highest vaddr", cmdLine);
		TCLAP::SwitchArg printEntryArg("E", "entrypoint", "Display entrypoint", cmdLine);
		TCLAP::SwitchArg printLowestVaddrArg("<", "lowest-vaddr", "Display lowest vaddr", cmdLine);
		TCLAP::ValueArg<std::string> printSymbolValueArg("S", "symbol-value", "Display symbol value", false, "", "sym", cmdLine);
		TCLAP::SwitchArg mipsUserToKernelArg("1", "to-kseg0", "Convert MIPS VMAs to kseg1", cmdLine);
		TCLAP::SwitchArg mipsKernelToUserArg("0", "to-kuseg", "Convert MIPS VMAs to kuseg", cmdLine);
		TCLAP::UnlabeledValueArg<std::string> inputArg("input", "Input (default stdin)", false, "-", "filename", cmdLine);

		cmdLine.parse(argc, argv);

		args.printHighestVaddr = printHighestVaddrArg.getValue();
		args.printLowestVaddr = printLowestVaddrArg.getValue();
		args.printEntry = printEntryArg.getValue();
		args.printSymbolValue = printSymbolValueArg.getValue();
		args.roundToPage = roundToPageArg.getValue();
		args.mips0to1 = mipsUserToKernelArg.getValue();
		args.mips1to0 = mipsKernelToUserArg.getValue();
		args.input = inputArg.getValue();

		return args;
	}